

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ons_ons_cluster_list.cc
# Opt level: O1

int __thiscall
aliyun::Ons::OnsClusterList
          (Ons *this,OnsOnsClusterListRequestType *req,OnsOnsClusterListResponseType *response,
          OnsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  size_type *psVar11;
  uint uVar12;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_4f8;
  Value local_4d8;
  Value *local_4c0;
  OnsOnsClusterListResponseType *local_4b8;
  uint local_4ac;
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Int local_468;
  _Alloc_hider local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  string local_3c8;
  undefined1 local_3a8 [24];
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  Value *local_368;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8._M_string_length = 0;
  local_3c8.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_3e8 = local_3d8;
  local_4b8 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_4f8);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_3e8,local_3e0 + (long)local_3e8);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_360.field_2._M_allocated_capacity = *psVar11;
    local_360.field_2._8_8_ = plVar7[3];
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  }
  else {
    local_360.field_2._M_allocated_capacity = *psVar11;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_4d8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"OnsClusterList","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->ons_region_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OnsRegionId","");
    pcVar2 = (req->ons_region_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->ons_region_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->ons_platform)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"OnsPlatform","");
    pcVar2 = (req->ons_platform)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->ons_platform)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->prevent_cache)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"PreventCache","");
    pcVar2 = (req->prevent_cache)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->prevent_cache)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->cluster)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Cluster","");
    pcVar2 = (req->cluster)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->cluster)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_4a8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_3c8);
    if (((0 < iVar4) && (local_3c8._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_3c8,&local_4d8,true), bVar3)) {
      if (error_info != (OnsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_4d8,"RequestId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar9);
        }
        else {
          local_4a8._0_8_ = local_4a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_2ee450 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_4a8);
        pcVar2 = local_4a8 + 0x10;
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4d8,"Code");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar9);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_2ee450 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4d8,"HostId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar9);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_2ee450 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4d8,"Message");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar9);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_2ee450 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
      }
      if (local_4b8 != (OnsOnsClusterListResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_4d8,"HelpUrl");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"HelpUrl");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar9);
          std::__cxx11::string::operator=((string *)&local_4b8->help_url,(string *)local_4a8);
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4d8,"Data");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_4d8,"Data");
          bVar3 = Json::Value::isMember(pVVar9,"ClusterInfoDataDo");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_4d8,"Data");
            pVVar9 = Json::Value::operator[](pVVar9,"ClusterInfoDataDo");
            bVar3 = Json::Value::isArray(pVVar9);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              pcVar2 = local_4a8 + 0x10;
              uVar12 = 0;
              local_368 = pVVar9;
              do {
                local_3a8._0_8_ = (pointer)0x0;
                local_3a8._8_8_ = (pointer)0x0;
                local_3a8._16_8_ = (pointer)0x0;
                local_390._M_p = (pointer)&local_380;
                local_388 = 0;
                local_380._M_local_buf[0] = '\0';
                local_4ac = uVar12;
                pVVar9 = Json::Value::operator[](pVVar9,uVar12);
                bVar3 = Json::Value::isMember(pVVar9,"ClusterName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"ClusterName");
                  Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_390,(string *)local_4a8);
                  if ((pointer)local_4a8._0_8_ != pcVar2) {
                    operator_delete((void *)local_4a8._0_8_,
                                    CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"BrokerInfoList");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"BrokerInfoList");
                  bVar3 = Json::Value::isMember(pVVar10,"BrokerInfoDataDo");
                  if (bVar3) {
                    pVVar9 = Json::Value::operator[](pVVar9,"BrokerInfoList");
                    pVVar9 = Json::Value::operator[](pVVar9,"BrokerInfoDataDo");
                    bVar3 = Json::Value::isArray(pVVar9);
                    local_4c0 = pVVar9;
                    if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
                      uVar12 = 0;
                      do {
                        local_4a8._8_8_ = 0;
                        local_4a8[0x10] = '\0';
                        local_488._M_p = (pointer)&local_478;
                        local_480 = 0;
                        local_478._M_local_buf[0] = '\0';
                        local_460._M_p = (pointer)&local_450;
                        local_458 = 0;
                        local_450._M_local_buf[0] = '\0';
                        local_440._M_p = (pointer)&local_430;
                        local_438 = 0;
                        local_430._M_local_buf[0] = '\0';
                        local_420._M_p = (pointer)&local_410;
                        local_418 = 0;
                        local_410._M_local_buf[0] = '\0';
                        local_4a8._0_8_ = pcVar2;
                        pVVar9 = Json::Value::operator[](local_4c0,uVar12);
                        bVar3 = Json::Value::isMember(pVVar9,"ClusterName");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"ClusterName");
                          Json::Value::asString_abi_cxx11_(&local_4f8,pVVar10);
                          std::__cxx11::string::operator=((string *)local_4a8,(string *)&local_4f8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            local_4f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"BrokerName");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"BrokerName");
                          Json::Value::asString_abi_cxx11_(&local_4f8,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_488,(string *)&local_4f8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            local_4f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"BrokerId");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"BrokerId");
                          local_468 = Json::Value::asInt(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"BrokerAddr");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"BrokerAddr");
                          Json::Value::asString_abi_cxx11_(&local_4f8,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_460,(string *)&local_4f8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            local_4f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"BrokerIp");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"BrokerIp");
                          Json::Value::asString_abi_cxx11_(&local_4f8,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_440,(string *)&local_4f8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            local_4f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"Version");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"Version");
                          Json::Value::asString_abi_cxx11_(&local_4f8,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_420,(string *)&local_4f8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            local_4f8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"InTPS");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"InTPS");
                          local_400 = Json::Value::asFloat(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"OutTPS");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"OutTPS");
                          local_3fc = Json::Value::asFloat(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"InTotalYest");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"InTotalYest");
                          local_3f8 = Json::Value::asFloat(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"OutTotalYest");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"OutTotalYest");
                          local_3f4 = Json::Value::asFloat(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"InTotalToday");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar9,"InTotalToday");
                          local_3f0 = Json::Value::asFloat(pVVar10);
                        }
                        bVar3 = Json::Value::isMember(pVVar9,"OutTotalToday");
                        if (bVar3) {
                          pVVar9 = Json::Value::operator[](pVVar9,"OutTotalToday");
                          local_3ec = Json::Value::asFloat(pVVar9);
                        }
                        std::
                        vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                        ::push_back((vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                                     *)local_3a8,(value_type *)local_4a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_420._M_p != &local_410) {
                          operator_delete(local_420._M_p,
                                          CONCAT71(local_410._M_allocated_capacity._1_7_,
                                                   local_410._M_local_buf[0]) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_440._M_p != &local_430) {
                          operator_delete(local_440._M_p,
                                          CONCAT71(local_430._M_allocated_capacity._1_7_,
                                                   local_430._M_local_buf[0]) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_460._M_p != &local_450) {
                          operator_delete(local_460._M_p,
                                          CONCAT71(local_450._M_allocated_capacity._1_7_,
                                                   local_450._M_local_buf[0]) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_488._M_p != &local_478) {
                          operator_delete(local_488._M_p,
                                          CONCAT71(local_478._M_allocated_capacity._1_7_,
                                                   local_478._M_local_buf[0]) + 1);
                        }
                        if ((pointer)local_4a8._0_8_ != pcVar2) {
                          operator_delete((void *)local_4a8._0_8_,
                                          CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
                        }
                        AVar5 = Json::Value::size(local_4c0);
                        uVar12 = uVar12 + 1;
                      } while (uVar12 < AVar5);
                    }
                  }
                }
                std::
                vector<aliyun::OnsOnsClusterListClusterInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListClusterInfoDataDoType>_>
                ::push_back(&local_4b8->data,(value_type *)local_3a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_p != &local_380) {
                  operator_delete(local_390._M_p,
                                  CONCAT71(local_380._M_allocated_capacity._1_7_,
                                           local_380._M_local_buf[0]) + 1);
                }
                std::
                vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                ::~vector((vector<aliyun::OnsOnsClusterListBrokerInfoDataDoType,_std::allocator<aliyun::OnsOnsClusterListBrokerInfoDataDoType>_>
                           *)local_3a8);
                pVVar9 = local_368;
                AVar5 = Json::Value::size(local_368);
                uVar12 = local_4ac + 1;
              } while (uVar12 < AVar5);
            }
          }
        }
      }
      goto LAB_00135a75;
    }
    if (error_info == (OnsErrorInfo *)0x0) goto LAB_00135a70;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (OnsErrorInfo *)0x0) {
LAB_00135a70:
      iVar4 = -1;
      goto LAB_00135a75;
    }
    pcVar6 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_00135a75:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_4d8);
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8,local_3d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT71(local_3c8.field_2._M_allocated_capacity._1_7_,
                             local_3c8.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ons::OnsClusterList(const OnsOnsClusterListRequestType& req,
                      OnsOnsClusterListResponseType* response,
                       OnsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","OnsClusterList");
  if(!req.ons_region_id.empty()) {
    req_rpc->AddRequestQuery("OnsRegionId", req.ons_region_id);
  }
  if(!req.ons_platform.empty()) {
    req_rpc->AddRequestQuery("OnsPlatform", req.ons_platform);
  }
  if(!req.prevent_cache.empty()) {
    req_rpc->AddRequestQuery("PreventCache", req.prevent_cache);
  }
  if(!req.cluster.empty()) {
    req_rpc->AddRequestQuery("Cluster", req.cluster);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}